

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Builder * __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::getResults
          (Builder *__return_storage_ptr__,RpcCallContext *this,Maybe<capnp::MessageSize> *sizeHint)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  RpcServerResponse *pRVar4;
  RpcConnectionState *pRVar5;
  Connected *pCVar6;
  Connection *pCVar7;
  OutgoingRpcMessage *pOVar8;
  RefOrVoid<capnp::_::RpcSystemBase::RpcConnectionState> params;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *params_1;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> *t;
  Maybe<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>_>
  local_150;
  Builder local_140;
  undefined1 local_118 [56];
  BuilderFor<capnp::rpc::Message> local_e0;
  undefined1 local_b8 [40];
  Maybe<capnp::MessageSize> local_90;
  undefined1 local_78 [8];
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> message;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> local_58 [2];
  undefined1 local_38 [8];
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> response;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> *r;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> *_r3258;
  Maybe<capnp::MessageSize> *sizeHint_local;
  RpcCallContext *this_local;
  
  response.ptr = (RpcServerResponse *)
                 kj::_::
                 readMaybe<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,decltype(nullptr)>
                           (&this->response);
  if ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> *)
      response.ptr !=
      (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> *)0x0) {
    pRVar4 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>
             ::operator->((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>
                           *)response.ptr);
    (**pRVar4->_vptr_RpcServerResponse)(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>::Own
            ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> *)
             local_38);
  if ((this->redirectResults & 1U) == 0) {
    pRVar5 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                       (&this->connectionState);
    bVar1 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
            is<capnp::_::RpcSystemBase::RpcConnectionState::Connected>(&pRVar5->connection);
    if (bVar1) {
      pRVar5 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                         (&this->connectionState);
      pCVar6 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
               get<capnp::_::RpcSystemBase::RpcConnectionState::Connected>(&pRVar5->connection);
      pCVar7 = kj::Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t>::operator->
                         (&pCVar6->connection);
      kj::Maybe<capnp::MessageSize>::Maybe(&local_90,sizeHint);
      uVar2 = anon_unknown_18::messageSizeHint<capnp::rpc::Return>();
      uVar3 = sizeInWords<capnp::rpc::Payload>();
      uVar2 = anon_unknown_18::firstSegmentSize(&local_90,uVar2 + uVar3);
      (**pCVar7->_vptr_Connection)(local_78,pCVar7,(ulong)uVar2);
      kj::Maybe<capnp::MessageSize>::~Maybe(&local_90);
      pOVar8 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->
                         ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)local_78);
      (**pOVar8->_vptr_OutgoingRpcMessage)(local_118 + 0x20);
      AnyPointer::Builder::initAs<capnp::rpc::Message>(&local_e0,(Builder *)(local_118 + 0x20));
      rpc::Message::Builder::initReturn((Builder *)local_b8,&local_e0);
      (this->returnMessage)._builder.dataSize = local_b8._32_4_;
      (this->returnMessage)._builder.pointerCount = local_b8._36_2_;
      *(undefined2 *)&(this->returnMessage)._builder.field_0x26 = local_b8._38_2_;
      (this->returnMessage)._builder.data = (void *)local_b8._16_8_;
      (this->returnMessage)._builder.pointers = (WirePointer *)local_b8._24_8_;
      (this->returnMessage)._builder.segment = (SegmentBuilder *)local_b8._0_8_;
      (this->returnMessage)._builder.capTable = (CapTableBuilder *)local_b8._8_8_;
      params = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator*
                         (&this->connectionState);
      params_1 = kj::mv<kj::Own<capnp::OutgoingRpcMessage,decltype(nullptr)>>
                           ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)local_78);
      rpc::Return::Builder::getResults(&local_140,&this->returnMessage);
      kj::
      heap<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::OutgoingRpcMessage,decltype(nullptr)>,capnp::rpc::Payload::Builder>
                ((kj *)local_118,params,params_1,&local_140);
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,decltype(nullptr)>::
      Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl,void>
                ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,decltype(nullptr)>
                  *)(local_118 + 0x10),
                 (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl,_std::nullptr_t>
                  *)local_118);
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>::
      operator=((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>
                 *)local_38,
                (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>
                 *)(local_118 + 0x10));
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>::~Own
                ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>
                  *)(local_118 + 0x10));
      kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl,_std::nullptr_t>::
      ~Own((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponseImpl,_std::nullptr_t>
            *)local_118);
      kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::~Own
                ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)local_78);
      goto LAB_005487f7;
    }
  }
  kj::
  refcounted<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse,kj::Maybe<capnp::MessageSize>&>
            ((kj *)&message.ptr,sizeHint);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,decltype(nullptr)>::
  Own<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse,void>
            ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,decltype(nullptr)>
              *)local_58,
             (Own<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse,_std::nullptr_t>
              *)&message.ptr);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>::operator=
            ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> *)
             local_38,local_58);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>::~Own
            (local_58);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse,_std::nullptr_t>
  ::~Own((Own<capnp::_::RpcSystemBase::RpcConnectionState::LocallyRedirectedRpcResponse,_std::nullptr_t>
          *)&message.ptr);
LAB_005487f7:
  pRVar4 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>::
           operator->((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>
                       *)local_38);
  (**pRVar4->_vptr_RpcServerResponse)(__return_storage_ptr__);
  t = kj::
      mv<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,decltype(nullptr)>>
                ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>
                  *)local_38);
  kj::
  Maybe<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>_>::
  Maybe(&local_150,t);
  kj::
  Maybe<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>_>::
  operator=(&this->response,&local_150);
  kj::
  Maybe<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>_>::
  ~Maybe(&local_150);
  kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t>::~Own
            ((Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcServerResponse,_std::nullptr_t> *)
             local_38);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Builder getResults(kj::Maybe<MessageSize> sizeHint) override {
      KJ_IF_SOME(r, response) {
        return r->getResultsBuilder();
      } else {
        kj::Own<RpcServerResponse> response;

        if (redirectResults || !connectionState->connection.is<Connected>()) {
          response = kj::refcounted<LocallyRedirectedRpcResponse>(sizeHint);
        } else {
          auto message = connectionState->connection.get<Connected>().connection
              ->newOutgoingMessage(
                  firstSegmentSize(sizeHint, messageSizeHint<rpc::Return>() +
                                  sizeInWords<rpc::Payload>()));
          returnMessage = message->getBody().initAs<rpc::Message>().initReturn();
          response = kj::heap<RpcServerResponseImpl>(
              *connectionState, kj::mv(message), returnMessage.getResults());
        }

        auto results = response->getResultsBuilder();
        this->response = kj::mv(response);
        return results;
      }